

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SonarLocalization.cpp
# Opt level: O1

void * SonarLocalizationThread(void *pParam)

{
  double dVar1;
  _Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
  *p_Var2;
  double dVar3;
  bool bVar4;
  int iVar5;
  interval *piVar6;
  _Map_pointer ppvVar7;
  int sdir_tmp;
  undefined4 uStack_6ec;
  double d_max_err_tmp;
  long lStack_6e0;
  double d_max_err_tmp_1;
  box local_6d0;
  double local_6c0;
  double local_6b8;
  double snr_loc_max_err;
  box P;
  long local_690;
  box P0;
  long local_678;
  vector<double,_std::allocator<double>_> circles_y_tmp_1;
  vector<double,_std::allocator<double>_> circles_x_tmp;
  double alpha_max_err_tmp_1;
  vector<double,_std::allocator<double>_> circles_r_tmp;
  vector<double,_std::allocator<double>_> circles_y_tmp;
  int sdir_tmp_1;
  vector<double,_std::allocator<double>_> circles_r_tmp_1;
  deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
  d_all_mes_vector_tmp;
  CHRONO chrono_dynamicsonarlocalization;
  vector<double,_std::allocator<double>_> walls_yb_tmp;
  CHRONO chrono_period;
  double local_4e8;
  box local_4e0;
  vector<double,_std::allocator<double>_> walls_xa_tmp;
  double alpha_max_err_tmp;
  box local_470;
  deque<double,_std::allocator<double>_> alpha_mes_vector_tmp;
  vector<double,_std::allocator<double>_> walls_xb_tmp;
  vector<double,_std::allocator<double>_> walls_ya_tmp;
  interval alphashat_tmp;
  interval psihat_tmp;
  interval local_2d0;
  interval local_2b8;
  interval local_2a0;
  interval local_288;
  interval local_270;
  interval local_258;
  interval local_240;
  interval local_228;
  interval local_210;
  interval local_1f8;
  interval local_1e0;
  interval local_1c8;
  interval local_1b0;
  interval local_198;
  interval local_180;
  interval local_168;
  interval local_150;
  interval local_138;
  interval local_120;
  interval local_108;
  interval local_f0;
  interval local_d8;
  interval local_c0;
  interval local_a8;
  interval local_90;
  interval local_78;
  interval local_60;
  interval local_48;
  
  bDynamicSonarLocalization = 0;
  iVar5 = clock_getres(4,(timespec *)&chrono_dynamicsonarlocalization.Frequency);
  if ((iVar5 == 0) &&
     (iVar5 = clock_gettime(4,(timespec *)&chrono_dynamicsonarlocalization), iVar5 == 0)) {
    chrono_dynamicsonarlocalization.Suspended = 0;
    chrono_dynamicsonarlocalization.Finish.tv_sec = 0;
    chrono_dynamicsonarlocalization.Finish.tv_nsec = 0;
    chrono_dynamicsonarlocalization.Duration.tv_sec = 0;
    chrono_dynamicsonarlocalization.Duration.tv_nsec = 0;
  }
  iVar5 = clock_getres(4,(timespec *)&chrono_period.Frequency);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,(timespec *)&chrono_period), iVar5 == 0)) {
    chrono_period.Suspended = 0;
    chrono_period.Finish.tv_sec = 0;
    chrono_period.Finish.tv_nsec = 0;
    chrono_period.Duration.tv_sec = 0;
    chrono_period.Duration.tv_nsec = 0;
  }
  do {
    if (chrono_period.Suspended == 0) {
      clock_gettime(4,(timespec *)&d_all_mes_vector_tmp);
      chrono_period.Finish.tv_sec =
           (__time_t)
           d_all_mes_vector_tmp.
           super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
           ._M_impl.super__Deque_impl_data._M_map;
      chrono_period.Finish.tv_nsec =
           d_all_mes_vector_tmp.
           super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
           ._M_impl.super__Deque_impl_data._M_map_size;
      d_all_mes_vector_tmp.
      super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           ((long)d_all_mes_vector_tmp.
                  super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map +
           (((long)(d_all_mes_vector_tmp.
                    super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map_size + chrono_period.Duration.tv_nsec) /
             1000000000 + chrono_period.Duration.tv_sec) - chrono_period.Start.tv_sec));
      d_all_mes_vector_tmp.
      super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size =
           (long)(d_all_mes_vector_tmp.
                  super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map_size + chrono_period.Duration.tv_nsec) %
           1000000000 - chrono_period.Start.tv_nsec;
      if ((long)d_all_mes_vector_tmp.
                super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size < 0) {
        d_all_mes_vector_tmp.
        super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)
             ((long)d_all_mes_vector_tmp.
                    super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map +
             (long)d_all_mes_vector_tmp.
                   super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size / 1000000000 + -1);
        d_all_mes_vector_tmp.
        super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size =
             (long)d_all_mes_vector_tmp.
                   super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size % 1000000000 + 1000000000;
      }
      chrono_period.Duration.tv_sec =
           (__time_t)
           d_all_mes_vector_tmp.
           super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
           ._M_impl.super__Deque_impl_data._M_map;
      chrono_period.Duration.tv_nsec =
           d_all_mes_vector_tmp.
           super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
           ._M_impl.super__Deque_impl_data._M_map_size;
    }
    iVar5 = clock_getres(4,(timespec *)&chrono_period.Frequency);
    if ((iVar5 == 0) && (iVar5 = clock_gettime(4,(timespec *)&chrono_period), iVar5 == 0)) {
      chrono_period.Suspended = 0;
      chrono_period.Duration.tv_sec = 0;
      chrono_period.Duration.tv_nsec = 0;
      chrono_period.Finish.tv_sec = 0;
      chrono_period.Finish.tv_nsec = 0;
    }
    d_all_mes_vector_tmp.
    super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    d_all_mes_vector_tmp.
    super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size = 50000000;
    nanosleep((timespec *)&d_all_mes_vector_tmp,(timespec *)0x0);
    if (bStaticSonarLocalization != 0) {
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      interval::interval(&local_48,(interval *)&xhat);
      interval::interval(&local_60,(interval *)&yhat);
      box::box(&P,(vector<interval,_std::allocator<interval>_> *)&local_48,
               (vector<interval,_std::allocator<interval>_> *)&local_60);
      bVar4 = box::IsEmpty(&P);
      if (bVar4) {
        alpha_mes_vector_tmp.super__Deque_base<double,_std::allocator<double>_>._M_impl.
        super__Deque_impl_data._M_map = (_Map_pointer)0xc0c3880000000000;
        psihat_tmp.inf = 10000.0;
        interval::interval(&local_198,(double *)&alpha_mes_vector_tmp,&psihat_tmp.inf);
        alphashat_tmp.inf = -10000.0;
        walls_xa_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x40c3880000000000;
        interval::interval(&local_78,&alphashat_tmp.inf,(double *)&walls_xa_tmp);
        box::box((box *)&d_all_mes_vector_tmp,
                 (vector<interval,_std::allocator<interval>_> *)&local_198,
                 (vector<interval,_std::allocator<interval>_> *)&local_78);
        box::operator=(&P,(box *)&d_all_mes_vector_tmp);
        box::~box((box *)&d_all_mes_vector_tmp);
      }
      std::
      deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ::deque(&d_all_mes_vector_tmp,&d_all_mes_vector);
      std::deque<double,_std::allocator<double>_>::deque(&alpha_mes_vector_tmp,&alpha_mes_vector);
      interval::interval(&psihat_tmp,(interval *)&psihat);
      d_max_err_tmp = d_max_err;
      alpha_max_err_tmp = alpha_max_err;
      _sdir_tmp = (double)CONCAT44(uStack_6ec,1);
      walls_xa_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      interval::interval(&alphashat_tmp,(double *)&walls_xa_tmp);
      std::vector<double,_std::allocator<double>_>::vector(&walls_xa_tmp,&walls_xa);
      std::vector<double,_std::allocator<double>_>::vector(&walls_ya_tmp,&walls_ya);
      std::vector<double,_std::allocator<double>_>::vector(&walls_xb_tmp,&walls_xb);
      std::vector<double,_std::allocator<double>_>::vector(&walls_yb_tmp,&walls_yb);
      std::vector<double,_std::allocator<double>_>::vector(&circles_x_tmp,&circles_x);
      std::vector<double,_std::allocator<double>_>::vector(&circles_y_tmp,&circles_y);
      std::vector<double,_std::allocator<double>_>::vector(&circles_r_tmp,&circles_r);
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      sched_yield();
      box::box(&local_470,&P);
      SIVIA(&P0,(deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                 *)&local_470,(deque<double,_std::allocator<double>_> *)&d_all_mes_vector_tmp,
            (interval *)&alpha_mes_vector_tmp,&psihat_tmp.inf,&d_max_err_tmp,
            (int *)&alpha_max_err_tmp,(interval *)&sdir_tmp,
            (vector<double,_std::allocator<double>_> *)&alphashat_tmp,&walls_xa_tmp,&walls_ya_tmp,
            &walls_xb_tmp,&walls_yb_tmp,&circles_x_tmp,&circles_y_tmp);
      box::operator=(&P,&P0);
      box::~box(&P0);
      box::~box(&local_470);
      sched_yield();
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      interval::interval(&local_1b0,(interval *)&xhat);
      interval::interval(&local_1c8,(interval *)&yhat);
      box::box(&P0,(vector<interval,_std::allocator<interval>_> *)&local_1b0,
               (vector<interval,_std::allocator<interval>_> *)&local_1c8);
      bVar4 = box::IsEmpty(&P0);
      if (bVar4) {
        circles_r_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0xc0c3880000000000;
        snr_loc_max_err = 10000.0;
        interval::interval(&local_1e0,(double *)&circles_r_tmp_1,&snr_loc_max_err);
        local_6d0.data = (interval *)0xc0c3880000000000;
        d_max_err_tmp_1 = 10000.0;
        interval::interval(&local_90,(double *)&local_6d0,&d_max_err_tmp_1);
        box::box((box *)&circles_y_tmp_1,(vector<interval,_std::allocator<interval>_> *)&local_1e0,
                 (vector<interval,_std::allocator<interval>_> *)&local_90);
        box::operator=(&P0,(box *)&circles_y_tmp_1);
        box::~box((box *)&circles_y_tmp_1);
      }
      box::Intersect(&P,&P0);
      dVar3 = d_max_err;
      dVar1 = sin(alpha_max_err);
      snr_loc_max_err = ABS(dVar1 + dVar3 + dVar1 + dVar3);
      bVar4 = box::IsEmpty(&P);
      if (bVar4) {
        local_6d0.data = (interval *)((ulong)snr_loc_max_err ^ 0x8000000000000000);
        interval::interval(&local_1f8,(double *)&local_6d0,&snr_loc_max_err);
        d_max_err_tmp_1 = -snr_loc_max_err;
        interval::interval(&local_a8,&d_max_err_tmp_1,&snr_loc_max_err);
        box::box((box *)&circles_r_tmp_1,(vector<interval,_std::allocator<interval>_> *)&local_1f8,
                 (vector<interval,_std::allocator<interval>_> *)&local_a8);
        operator+((box *)&circles_y_tmp_1,&P0);
        box::operator=(&P,(box *)&circles_y_tmp_1);
        box::~box((box *)&circles_y_tmp_1);
      }
      else {
        local_6d0.data = (interval *)((ulong)snr_loc_max_err ^ 0x8000000000000000);
        interval::interval(&local_210,(double *)&local_6d0,&snr_loc_max_err);
        d_max_err_tmp_1 = -snr_loc_max_err;
        interval::interval(&local_c0,&d_max_err_tmp_1,&snr_loc_max_err);
        box::box((box *)&circles_r_tmp_1,(vector<interval,_std::allocator<interval>_> *)&local_210,
                 (vector<interval,_std::allocator<interval>_> *)&local_c0);
        operator+((box *)&circles_y_tmp_1,&P);
        box::operator=(&P,(box *)&circles_y_tmp_1);
        box::~box((box *)&circles_y_tmp_1);
      }
      box::~box((box *)&circles_r_tmp_1);
      bVar4 = box::IsEmpty(&P);
      if (bVar4) {
        circles_r_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0xc0c3880000000000;
        local_6d0.data = (interval *)0x40c3880000000000;
        interval::interval(&local_228,(double *)&circles_r_tmp_1,(double *)&local_6d0);
        d_max_err_tmp_1 = -10000.0;
        alpha_max_err_tmp_1 = 10000.0;
        interval::interval(&local_d8,&d_max_err_tmp_1,&alpha_max_err_tmp_1);
        box::box((box *)&circles_y_tmp_1,(vector<interval,_std::allocator<interval>_> *)&local_228,
                 (vector<interval,_std::allocator<interval>_> *)&local_d8);
        box::operator=(&P,(box *)&circles_y_tmp_1);
        box::~box((box *)&circles_y_tmp_1);
      }
      piVar6 = box::operator[](&P,1);
      interval::operator=((interval *)&xhat,piVar6);
      piVar6 = box::operator[](&P,2);
      interval::operator=((interval *)&yhat,piVar6);
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      bStaticSonarLocalization = 0;
      box::~box(&P0);
      if (circles_r_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(circles_r_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)circles_r_tmp.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)circles_r_tmp.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (circles_y_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(circles_y_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)circles_y_tmp.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)circles_y_tmp.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (walls_yb_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(walls_yb_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)walls_yb_tmp.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)walls_yb_tmp.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (walls_xb_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(walls_xb_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)walls_xb_tmp.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)walls_xb_tmp.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (walls_ya_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(walls_ya_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)walls_ya_tmp.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)walls_ya_tmp.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (walls_xa_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(walls_xa_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)walls_xa_tmp.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)walls_xa_tmp.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base
                (&alpha_mes_vector_tmp.super__Deque_base<double,_std::allocator<double>_>);
      std::
      deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ::~deque(&d_all_mes_vector_tmp);
      box::~box(&P);
    }
    if (bDynamicSonarLocalization != 0) {
      if (chrono_dynamicsonarlocalization.Suspended == 0) {
        clock_gettime(4,(timespec *)&d_all_mes_vector_tmp);
        d_all_mes_vector_tmp.
        super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)
             ((long)d_all_mes_vector_tmp.
                    super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map +
             (((long)(d_all_mes_vector_tmp.
                      super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map_size +
                     chrono_dynamicsonarlocalization.Duration.tv_nsec) / 1000000000 +
              chrono_dynamicsonarlocalization.Duration.tv_sec) -
             chrono_dynamicsonarlocalization.Start.tv_sec));
        d_all_mes_vector_tmp.
        super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
        ._M_impl.super__Deque_impl_data._M_map_size =
             (long)(d_all_mes_vector_tmp.
                    super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_map_size +
                   chrono_dynamicsonarlocalization.Duration.tv_nsec) % 1000000000 -
             chrono_dynamicsonarlocalization.Start.tv_nsec;
        if ((long)d_all_mes_vector_tmp.
                  super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map_size < 0) {
          d_all_mes_vector_tmp.
          super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map =
               (_Map_pointer)
               ((long)d_all_mes_vector_tmp.
                      super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_map +
               (long)d_all_mes_vector_tmp.
                     super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_map_size / 1000000000 + -1);
          d_all_mes_vector_tmp.
          super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map_size =
               (long)d_all_mes_vector_tmp.
                     super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_map_size % 1000000000 + 1000000000;
        }
        p_Var2 = &d_all_mes_vector_tmp.
                  super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
        ;
        ppvVar7 = d_all_mes_vector_tmp.
                  super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map;
      }
      else {
        p_Var2 = (_Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                  *)&chrono_dynamicsonarlocalization.Duration;
        ppvVar7 = (_Map_pointer)chrono_dynamicsonarlocalization.Duration.tv_sec;
      }
      if (dynamicsonarlocalization_period <
          (double)(long)(p_Var2->_M_impl).super__Deque_impl_data._M_map_size / 1000000000.0 +
          (double)(long)ppvVar7) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        interval::interval(&local_f0,(interval *)&xhat);
        interval::interval(&local_108,(interval *)&yhat);
        box::box((box *)&alpha_max_err_tmp,(vector<interval,_std::allocator<interval>_> *)&local_f0,
                 (vector<interval,_std::allocator<interval>_> *)&local_108);
        bVar4 = box::IsEmpty((box *)&alpha_max_err_tmp);
        if (bVar4) {
          alpha_mes_vector_tmp.super__Deque_base<double,_std::allocator<double>_>._M_impl.
          super__Deque_impl_data._M_map = (_Map_pointer)0xc0c3880000000000;
          psihat_tmp.inf = 10000.0;
          interval::interval(&local_240,(double *)&alpha_mes_vector_tmp,&psihat_tmp.inf);
          alphashat_tmp.inf = -10000.0;
          walls_xa_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x40c3880000000000;
          interval::interval(&local_120,&alphashat_tmp.inf,(double *)&walls_xa_tmp);
          box::box((box *)&d_all_mes_vector_tmp,
                   (vector<interval,_std::allocator<interval>_> *)&local_240,
                   (vector<interval,_std::allocator<interval>_> *)&local_120);
          box::operator=((box *)&alpha_max_err_tmp,(box *)&d_all_mes_vector_tmp);
          box::~box((box *)&d_all_mes_vector_tmp);
        }
        std::
        deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
        ::deque(&d_all_mes_vector_tmp,&d_all_mes_vector);
        std::deque<double,_std::allocator<double>_>::deque(&alpha_mes_vector_tmp,&alpha_mes_vector);
        std::deque<double,_std::allocator<double>_>::deque
                  ((deque<double,_std::allocator<double>_> *)&psihat_tmp,&t_history_vector);
        std::deque<interval,_std::allocator<interval>_>::deque
                  ((deque<interval,_std::allocator<interval>_> *)&alphashat_tmp,&xhat_history_vector
                  );
        std::deque<interval,_std::allocator<interval>_>::deque
                  ((deque<interval,_std::allocator<interval>_> *)&walls_xa_tmp,&yhat_history_vector)
        ;
        std::deque<interval,_std::allocator<interval>_>::deque
                  ((deque<interval,_std::allocator<interval>_> *)&walls_ya_tmp,
                   &psihat_history_vector);
        std::deque<interval,_std::allocator<interval>_>::deque
                  ((deque<interval,_std::allocator<interval>_> *)&walls_xb_tmp,
                   &vrxhat_history_vector);
        d_max_err_tmp_1 = d_max_err;
        alpha_max_err_tmp_1 = alpha_max_err;
        sdir_tmp_1 = 1;
        circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        interval::interval((interval *)&walls_yb_tmp,(double *)&circles_x_tmp);
        std::vector<double,_std::allocator<double>_>::vector(&circles_x_tmp,&walls_xa);
        std::vector<double,_std::allocator<double>_>::vector(&circles_y_tmp,&walls_ya);
        std::vector<double,_std::allocator<double>_>::vector(&circles_r_tmp,&walls_xb);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&P,&walls_yb);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&P0,&circles_x);
        std::vector<double,_std::allocator<double>_>::vector(&circles_y_tmp_1,&circles_y);
        std::vector<double,_std::allocator<double>_>::vector(&circles_r_tmp_1,&circles_r);
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        sched_yield();
        box::box(&local_4e0,(box *)&alpha_max_err_tmp);
        SIVIA_dyn((box *)&d_max_err_tmp,
                  (deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                   *)&local_4e0,(deque<double,_std::allocator<double>_> *)&d_all_mes_vector_tmp,
                  &alpha_mes_vector_tmp,(deque<interval,_std::allocator<interval>_> *)&psihat_tmp,
                  (deque<interval,_std::allocator<interval>_> *)&alphashat_tmp,
                  (deque<interval,_std::allocator<interval>_> *)&walls_xa_tmp,
                  (deque<interval,_std::allocator<interval>_> *)&walls_ya_tmp,
                  (double *)&walls_xb_tmp,&d_max_err_tmp_1,(int *)&alpha_max_err_tmp_1,
                  (interval *)&sdir_tmp_1,&walls_yb_tmp,&circles_x_tmp,&circles_y_tmp,&circles_r_tmp
                  ,(vector<double,_std::allocator<double>_> *)&P,
                  (vector<double,_std::allocator<double>_> *)&P0,&circles_y_tmp_1);
        box::operator=((box *)&alpha_max_err_tmp,(box *)&d_max_err_tmp);
        box::~box((box *)&d_max_err_tmp);
        box::~box(&local_4e0);
        sched_yield();
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        interval::interval(&local_258,(interval *)&xhat);
        interval::interval(&local_270,(interval *)&yhat);
        box::box((box *)&snr_loc_max_err,(vector<interval,_std::allocator<interval>_> *)&local_258,
                 (vector<interval,_std::allocator<interval>_> *)&local_270);
        bVar4 = box::IsEmpty((box *)&snr_loc_max_err);
        if (bVar4) {
          local_6d0.data = (interval *)0xc0c3880000000000;
          _sdir_tmp = 10000.0;
          interval::interval(&local_288,(double *)&local_6d0,(double *)&sdir_tmp);
          local_6b8 = -10000.0;
          local_6c0 = 10000.0;
          interval::interval(&local_138,&local_6b8,&local_6c0);
          box::box((box *)&d_max_err_tmp,(vector<interval,_std::allocator<interval>_> *)&local_288,
                   (vector<interval,_std::allocator<interval>_> *)&local_138);
          box::operator=((box *)&snr_loc_max_err,(box *)&d_max_err_tmp);
          box::~box((box *)&d_max_err_tmp);
        }
        box::Intersect((box *)&alpha_max_err_tmp,(box *)&snr_loc_max_err);
        dVar3 = d_max_err;
        dVar1 = sin(alpha_max_err);
        _sdir_tmp = ABS(dVar1 + dVar3 + dVar1 + dVar3);
        bVar4 = box::IsEmpty((box *)&alpha_max_err_tmp);
        if (bVar4) {
          local_6b8 = -_sdir_tmp;
          interval::interval(&local_2a0,&local_6b8,(double *)&sdir_tmp);
          local_6c0 = -_sdir_tmp;
          interval::interval(&local_150,&local_6c0,(double *)&sdir_tmp);
          box::box(&local_6d0,(vector<interval,_std::allocator<interval>_> *)&local_2a0,
                   (vector<interval,_std::allocator<interval>_> *)&local_150);
          operator+((box *)&d_max_err_tmp,(box *)&snr_loc_max_err);
          box::operator=((box *)&alpha_max_err_tmp,(box *)&d_max_err_tmp);
        }
        else {
          local_6b8 = -_sdir_tmp;
          interval::interval(&local_2b8,&local_6b8,(double *)&sdir_tmp);
          local_6c0 = -_sdir_tmp;
          interval::interval(&local_168,&local_6c0,(double *)&sdir_tmp);
          box::box(&local_6d0,(vector<interval,_std::allocator<interval>_> *)&local_2b8,
                   (vector<interval,_std::allocator<interval>_> *)&local_168);
          operator+((box *)&d_max_err_tmp,(box *)&alpha_max_err_tmp);
          box::operator=((box *)&alpha_max_err_tmp,(box *)&d_max_err_tmp);
        }
        box::~box((box *)&d_max_err_tmp);
        box::~box(&local_6d0);
        bVar4 = box::IsEmpty((box *)&alpha_max_err_tmp);
        if (bVar4) {
          local_6d0.data = (interval *)0xc0c3880000000000;
          local_6b8 = 10000.0;
          interval::interval(&local_2d0,(double *)&local_6d0,&local_6b8);
          local_6c0 = -10000.0;
          local_4e8 = 10000.0;
          interval::interval(&local_180,&local_6c0,&local_4e8);
          box::box((box *)&d_max_err_tmp,(vector<interval,_std::allocator<interval>_> *)&local_2d0,
                   (vector<interval,_std::allocator<interval>_> *)&local_180);
          box::operator=((box *)&alpha_max_err_tmp,(box *)&d_max_err_tmp);
          box::~box((box *)&d_max_err_tmp);
        }
        piVar6 = box::operator[]((box *)&alpha_max_err_tmp,1);
        interval::operator=((interval *)&xhat,piVar6);
        piVar6 = box::operator[]((box *)&alpha_max_err_tmp,2);
        interval::operator=((interval *)&yhat,piVar6);
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        if (chrono_dynamicsonarlocalization.Suspended == 0) {
          clock_gettime(4,(timespec *)&d_max_err_tmp);
          chrono_dynamicsonarlocalization.Finish.tv_sec = (__time_t)d_max_err_tmp;
          chrono_dynamicsonarlocalization.Finish.tv_nsec = lStack_6e0;
          d_max_err_tmp =
               (double)(((long)d_max_err_tmp + chrono_dynamicsonarlocalization.Duration.tv_sec +
                        (lStack_6e0 + chrono_dynamicsonarlocalization.Duration.tv_nsec) / 1000000000
                        ) - chrono_dynamicsonarlocalization.Start.tv_sec);
          lStack_6e0 = (lStack_6e0 + chrono_dynamicsonarlocalization.Duration.tv_nsec) % 1000000000
                       - chrono_dynamicsonarlocalization.Start.tv_nsec;
          if (lStack_6e0 < 0) {
            d_max_err_tmp = (double)((long)d_max_err_tmp + lStack_6e0 / 1000000000 + -1);
            lStack_6e0 = lStack_6e0 % 1000000000 + 1000000000;
          }
          chrono_dynamicsonarlocalization.Duration.tv_sec = (__time_t)d_max_err_tmp;
          chrono_dynamicsonarlocalization.Duration.tv_nsec = lStack_6e0;
        }
        iVar5 = clock_getres(4,(timespec *)&chrono_dynamicsonarlocalization.Frequency);
        if ((iVar5 == 0) &&
           (iVar5 = clock_gettime(4,(timespec *)&chrono_dynamicsonarlocalization), iVar5 == 0)) {
          chrono_dynamicsonarlocalization.Suspended = 0;
          chrono_dynamicsonarlocalization.Duration.tv_sec = 0;
          chrono_dynamicsonarlocalization.Duration.tv_nsec = 0;
          chrono_dynamicsonarlocalization.Finish.tv_sec = 0;
          chrono_dynamicsonarlocalization.Finish.tv_nsec = 0;
        }
        box::~box((box *)&snr_loc_max_err);
        if (circles_r_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(circles_r_tmp_1.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)circles_r_tmp_1.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)circles_r_tmp_1.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (circles_y_tmp_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(circles_y_tmp_1.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)circles_y_tmp_1.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)circles_y_tmp_1.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (P0.data != (interval *)0x0) {
          operator_delete(P0.data,local_678 - (long)P0.data);
        }
        if (P.data != (interval *)0x0) {
          operator_delete(P.data,local_690 - (long)P.data);
        }
        if (circles_r_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(circles_r_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)circles_r_tmp.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)circles_r_tmp.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (circles_y_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(circles_y_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)circles_y_tmp.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)circles_y_tmp.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)circles_x_tmp.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::_Deque_base<interval,_std::allocator<interval>_>::~_Deque_base
                  ((_Deque_base<interval,_std::allocator<interval>_> *)&walls_xb_tmp);
        std::_Deque_base<interval,_std::allocator<interval>_>::~_Deque_base
                  ((_Deque_base<interval,_std::allocator<interval>_> *)&walls_ya_tmp);
        std::_Deque_base<interval,_std::allocator<interval>_>::~_Deque_base
                  ((_Deque_base<interval,_std::allocator<interval>_> *)&walls_xa_tmp);
        std::_Deque_base<interval,_std::allocator<interval>_>::~_Deque_base
                  ((_Deque_base<interval,_std::allocator<interval>_> *)&alphashat_tmp);
        std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base
                  ((_Deque_base<double,_std::allocator<double>_> *)&psihat_tmp);
        std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base
                  (&alpha_mes_vector_tmp.super__Deque_base<double,_std::allocator<double>_>);
        std::
        deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
        ::~deque(&d_all_mes_vector_tmp);
        box::~box((box *)&alpha_max_err_tmp);
      }
    }
  } while (bExit == 0);
  if (chrono_period.Suspended == 0) {
    clock_gettime(4,(timespec *)&d_all_mes_vector_tmp);
    chrono_period.Finish.tv_sec =
         (__time_t)
         d_all_mes_vector_tmp.
         super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
         ._M_impl.super__Deque_impl_data._M_map;
    chrono_period.Finish.tv_nsec =
         d_all_mes_vector_tmp.
         super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size;
    d_all_mes_vector_tmp.
    super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)
         ((long)d_all_mes_vector_tmp.
                super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map +
         (((long)(d_all_mes_vector_tmp.
                  super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map_size + chrono_period.Duration.tv_nsec) /
           1000000000 + chrono_period.Duration.tv_sec) - chrono_period.Start.tv_sec));
    d_all_mes_vector_tmp.
    super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size =
         (long)(d_all_mes_vector_tmp.
                super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size + chrono_period.Duration.tv_nsec) %
         1000000000 - chrono_period.Start.tv_nsec;
    if ((long)d_all_mes_vector_tmp.
              super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size < 0) {
      d_all_mes_vector_tmp.
      super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           ((long)d_all_mes_vector_tmp.
                  super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map +
           (long)d_all_mes_vector_tmp.
                 super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map_size / 1000000000 + -1);
      d_all_mes_vector_tmp.
      super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size =
           (long)d_all_mes_vector_tmp.
                 super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_map_size % 1000000000 + 1000000000;
    }
    chrono_period.Duration.tv_sec =
         (__time_t)
         d_all_mes_vector_tmp.
         super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
         ._M_impl.super__Deque_impl_data._M_map;
    chrono_period.Duration.tv_nsec =
         d_all_mes_vector_tmp.
         super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size;
  }
  if (chrono_dynamicsonarlocalization.Suspended == 0) {
    clock_gettime(4,(timespec *)&d_all_mes_vector_tmp);
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SonarLocalizationThread(void* pParam)
{
	CHRONO chrono_period;
	CHRONO chrono_dynamicsonarlocalization;

	UNREFERENCED_PARAMETER(pParam);

	// Dynamic sonar localization disabled by default, use enable/disabledynamicsonarlocalization commands to enable/disable...
	bDynamicSonarLocalization = FALSE;

	StartChrono(&chrono_dynamicsonarlocalization);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		uSleep(1000*50);

		if (bStaticSonarLocalization)
		{

			// What if there is no sonar connected...?


			EnterCriticalSection(&StateVariablesCS);
			// Initial box to be able to contract...?
			box P = box(xhat,yhat);
			if (P.IsEmpty()) P = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));

			deque< vector<interval> > d_all_mes_vector_tmp = d_all_mes_vector; deque<double> alpha_mes_vector_tmp = alpha_mes_vector; 
			interval psihat_tmp = psihat; 
			double d_max_err_tmp = d_max_err; double alpha_max_err_tmp = alpha_max_err; int sdir_tmp = 1; interval alphashat_tmp = 0; 
			vector<double> walls_xa_tmp = walls_xa; vector<double> walls_ya_tmp = walls_ya; vector<double> walls_xb_tmp = walls_xb; vector<double> walls_yb_tmp = walls_yb; 
			vector<double> circles_x_tmp = circles_x; vector<double> circles_y_tmp = circles_y; vector<double> circles_r_tmp = circles_r;
			LeaveCriticalSection(&StateVariablesCS);

			ThreadYield();

			P = SIVIA(P, d_all_mes_vector_tmp, alpha_mes_vector_tmp, 
				psihat_tmp, 
				d_max_err_tmp, alpha_max_err_tmp, sdir_tmp, alphashat_tmp, 
				walls_xa_tmp, walls_ya_tmp, walls_xb_tmp, walls_yb_tmp, 
				circles_x_tmp, circles_y_tmp, circles_r_tmp);

			ThreadYield();

			EnterCriticalSection(&StateVariablesCS);
			box P0 = box(xhat,yhat); // Need to check for other position updates since the computations were long...
			if (P0.IsEmpty()) P0 = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));
			P.Intersect(P0);
			double snr_loc_max_err = fabs(2*(d_max_err+sin(alpha_max_err)));
			if (P.IsEmpty()) 
			{
				// Expand initial box to be able to contract next time and because we are probably lost...
				P = P0+box(interval(-snr_loc_max_err,snr_loc_max_err),interval(-snr_loc_max_err,snr_loc_max_err));
			}
			else
			{
				// P is likely to be with a small width so we expand...
				P = P+box(interval(-snr_loc_max_err,snr_loc_max_err),interval(-snr_loc_max_err,snr_loc_max_err));
			}
			if (P.IsEmpty()) P = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));
			xhat = P[1];
			yhat = P[2];
			LeaveCriticalSection(&StateVariablesCS);

			bStaticSonarLocalization = FALSE;
		}

		if (bDynamicSonarLocalization&&(GetTimeElapsedChronoQuick(&chrono_dynamicsonarlocalization) > dynamicsonarlocalization_period))
		{

			// What if there is no sonar connected...?


			EnterCriticalSection(&StateVariablesCS);
			// Initial box to be able to contract...?
			box P = box(xhat,yhat);
			if (P.IsEmpty()) P = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));

			deque< vector<interval> > d_all_mes_vector_tmp = d_all_mes_vector; deque<double> alpha_mes_vector_tmp = alpha_mes_vector; 
			deque<double> t_history_vector_tmp = t_history_vector; deque<interval> xhat_history_vector_tmp = xhat_history_vector; deque<interval> yhat_history_vector_tmp = yhat_history_vector; 
			deque<interval> psihat_history_vector_tmp = psihat_history_vector; deque<interval> vrxhat_history_vector_tmp = vrxhat_history_vector; 
			double d_max_err_tmp = d_max_err; double alpha_max_err_tmp = alpha_max_err; int sdir_tmp = 1; interval alphashat_tmp = 0; 
			vector<double> walls_xa_tmp = walls_xa; vector<double> walls_ya_tmp = walls_ya; vector<double> walls_xb_tmp = walls_xb; vector<double> walls_yb_tmp = walls_yb; 
			vector<double> circles_x_tmp = circles_x; vector<double> circles_y_tmp = circles_y; vector<double> circles_r_tmp = circles_r;
			LeaveCriticalSection(&StateVariablesCS);

			ThreadYield();

			P = SIVIA_dyn(P, d_all_mes_vector_tmp, alpha_mes_vector_tmp, 
				t_history_vector_tmp, xhat_history_vector_tmp, yhat_history_vector_tmp, 
				psihat_history_vector_tmp, vrxhat_history_vector_tmp, 
				d_max_err_tmp, alpha_max_err_tmp, sdir_tmp, alphashat_tmp, 
				walls_xa_tmp, walls_ya_tmp, walls_xb_tmp, walls_yb_tmp, 
				circles_x_tmp, circles_y_tmp, circles_r_tmp);

			ThreadYield();

			EnterCriticalSection(&StateVariablesCS);
			box P0 = box(xhat,yhat); // Need to check for other position updates since the computations were long...
			if (P0.IsEmpty()) P0 = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));
			P.Intersect(P0);
			double snr_loc_max_err = fabs(2*(d_max_err+sin(alpha_max_err)));
			if (P.IsEmpty()) 
			{
				// Expand initial box to be able to contract next time and because we are probably lost...
				P = P0+box(interval(-snr_loc_max_err,snr_loc_max_err),interval(-snr_loc_max_err,snr_loc_max_err));
			}
			else
			{
				// P is likely to be with a small width so we expand...
				P = P+box(interval(-snr_loc_max_err,snr_loc_max_err),interval(-snr_loc_max_err,snr_loc_max_err));
			}
			if (P.IsEmpty()) P = box(interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY),interval(-MAX_UNCERTAINTY,MAX_UNCERTAINTY));
			xhat = P[1];
			yhat = P[2];
			LeaveCriticalSection(&StateVariablesCS);

			StopChronoQuick(&chrono_dynamicsonarlocalization);
			StartChrono(&chrono_dynamicsonarlocalization);
		}

		//printf("SonarLocalizationThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));

		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_dynamicsonarlocalization);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}